

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

void __thiscall
QCborStreamReaderPrivate::QCborStreamReaderPrivate(QCborStreamReaderPrivate *this,QByteArray *data)

{
  this->device = (QIODevice *)0x0;
  QArrayDataPointer<char>::QArrayDataPointer(&(this->buffer).d,&data->d);
  (this->containerStack).super_QList<CborValue>.d.size = 0;
  (this->containerStack).super_QList<CborValue>.d.d = (Data *)0x0;
  (this->containerStack).super_QList<CborValue>.d.ptr = (CborValue *)0x0;
  (this->lastError).c = NoError;
  this->bufferStart = 0;
  this->corrupt = false;
  initDecoder(this);
  return;
}

Assistant:

QCborStreamReaderPrivate(const QByteArray &data)
        : device(nullptr), buffer(data)
    {
        initDecoder();
    }